

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O1

error<idx2::idx2_err_code>
idx2::TraverseFirstLevel
          (idx2_file *Idx2,params *P,decode_data *D,grid *OutGrid,mmap_volume *OutVolFile,
          volume *OutVolMem)

{
  uint uVar1;
  mutex *__mutex;
  atomic<unsigned_long> *paVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  i64 iVar7;
  i32 iVar8;
  decode_data *pdVar9;
  undefined4 uVar10;
  long lVar11;
  file_traverse *pfVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char Level;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  u64 uVar21;
  int iVar22;
  u64 uVar23;
  ulong *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  long *in_FS_OFFSET;
  extent eVar39;
  v3i Brick3;
  uint local_2de0;
  uint local_2ddc;
  chunk_traverse Second_1;
  decode_data *D_local;
  long local_2d60;
  uint local_2d58;
  int local_2d54;
  ulong local_2d50;
  extent Skip;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 local_2d28;
  long lStack_2d20;
  ulong uStack_2d18;
  u64 uStack_2d10;
  extent local_2d08;
  extent local_2cf8;
  ulong local_2ce8;
  extent *local_2ce0;
  params *local_2cd8;
  grid *local_2cd0;
  extent Skip_1;
  volume *OutVolMem_local;
  mmap_volume *OutVolFile_local;
  extent local_2ca8;
  extent local_2c98;
  extent local_2c88;
  undefined4 local_2c74;
  undefined4 uStack_2c70;
  undefined4 uStack_2c6c;
  undefined4 uStack_2c68;
  undefined7 uStack_2c63;
  undefined4 local_2c5c;
  undefined4 uStack_2c58;
  undefined4 uStack_2c54;
  undefined4 uStack_2c50;
  undefined4 local_2c4c;
  extent local_2c48;
  file_traverse Second;
  ulong local_2c08;
  u64 local_2c00 [3];
  undefined1 auStack_2be8 [8];
  undefined8 uStack_2be0;
  undefined1 auStack_2bd8 [8];
  u64 auStack_2bd0 [497];
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  file_traverse First;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1c08;
  u64 local_1c00 [3];
  undefined1 auStack_1be8 [8];
  u64 auStack_1be0 [3];
  ulong auStack_1bc8 [498];
  file_traverse FileStack [64];
  
  uVar23 = 0x100000000;
  Level = Idx2->NLevels + -1;
  local_2cf8.From = 0;
  local_2cf8.Dims = 0;
  local_2d08.From = 0;
  local_2d08.Dims = 0;
  local_2ca8.From = 0;
  local_2ca8.Dims = 0;
  local_2c88.From = 0;
  local_2c88.Dims = 0;
  local_2c98.From = 0;
  local_2c98.Dims = 0;
  local_2ce0 = &P->DecodeExtent;
  local_2c48.From = 0;
  local_2c48.Dims = 0;
  uVar25 = (uint)Level;
  D_local = D;
  local_2cd8 = P;
  local_2cd0 = OutGrid;
  OutVolMem_local = OutVolMem;
  OutVolFile_local = OutVolFile;
  ComputeExtentsForTraversal
            (Idx2,local_2ce0,Level,&local_2cf8,&local_2d08,&local_2ca8,&local_2c88,&local_2c98,
             &local_2c48);
  if (Level < '\x01') {
    iVar30 = 1;
    iVar31 = 1;
    iVar34 = 1;
  }
  else {
    iVar30 = 1;
    iVar31 = 1;
    iVar34 = 1;
    uVar26 = uVar25;
    do {
      iVar34 = iVar34 * (Idx2->GroupBrick3).field_0.field_0.Z;
      iVar30 = (Idx2->GroupBrick3).field_0.field_0.X * iVar30;
      iVar31 = iVar31 * (Idx2->GroupBrick3).field_0.field_0.Y;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  uVar26 = (Idx2->BrickDims3).field_0.field_0.X * iVar30;
  uVar20 = (ulong)(uint)(iVar31 * (Idx2->BrickDims3).field_0.field_0.Y);
  uVar19 = (ulong)(uint)(iVar34 * (Idx2->BrickDims3).field_0.field_0.Z);
  local_2d58 = uVar25;
  if (Mallocator()::Instance == '\0') goto LAB_0018adff;
LAB_00189d63:
  lVar11 = 0x28;
  do {
    *(undefined8 *)((long)&FileStack[0].FileOrder + lVar11) = 0;
    lVar11 = lVar11 + 0x30;
  } while (lVar11 != 0xc28);
  if ('\x0f' < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  uVar25 = (uint)uVar19;
  lVar11 = (long)Level;
  lVar17 = (long)(Idx2->NFiles3).Arr[lVar11].field_0.field_0.X;
  if (lVar17 == 0) {
    uVar19 = 1;
  }
  else {
    uVar18 = lVar17 - 1;
    lVar17 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    uVar19 = 1L << (-((byte)lVar17 ^ 0x3f) & 0x3f) & 0xffffffff;
    if (uVar18 == 0) {
      uVar19 = 1;
    }
  }
  lVar17 = (long)(Idx2->NFiles3).Arr[lVar11].field_0.field_0.Y;
  if (lVar17 != 0) {
    uVar18 = lVar17 - 1;
    lVar17 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    if (uVar18 != 0) {
      uVar23 = uVar23 << (-((byte)lVar17 ^ 0x3f) & 0x3f);
    }
  }
  lVar17 = (long)(Idx2->NFiles3).Arr[lVar11].field_0.field_0.Z;
  FileStack[0].FileTo3.field_0._8_4_ = 1;
  if (lVar17 != 0) {
    uVar18 = lVar17 - 1;
    lVar17 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    FileStack[0].FileTo3.field_0._8_4_ = 1;
    if (uVar18 != 0) {
      FileStack[0].FileTo3.field_0._8_4_ = (undefined4)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
    }
  }
  FileStack[0].FileOrder = (Idx2->FilesOrder).Arr[lVar11];
  FileStack[0].PrevOrder = FileStack[0].FileOrder;
  FileStack[0].FileFrom3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  FileStack[0].FileFrom3.field_0.field_0.Z = 0;
  FileStack[0].FileTo3.field_0.field_3.XY.field_0 = uVar23 | uVar19;
  FileStack[0].Address = 0;
  local_2ce8 = (ulong)(uVar25 & 0x1fffff) << 0x2a |
               (ulong)((uint)uVar20 & 0x1fffff) << 0x15 | (ulong)(uVar26 & 0x1fffff);
  local_2de0 = 0;
  local_2d60 = lVar11;
  local_2d50 = uVar20;
  do {
    pfVar12 = FileStack + local_2de0;
    uVar19 = pfVar12->FileOrder;
    uVar20 = uVar19 >> 2;
    pfVar12->FileOrder = uVar20;
    uVar33 = (uint)uVar19;
    if ((~uVar33 & 3) == 0) {
      if (uVar20 == 3) {
        pfVar12->FileOrder = FileStack[local_2de0].PrevOrder;
      }
      else {
        FileStack[local_2de0].PrevOrder = uVar20;
      }
    }
    else {
      uVar1 = local_2de0 - 1;
      iVar30 = FileStack[local_2de0].FileFrom3.field_0.field_0.X;
      if (((FileStack[local_2de0].FileTo3.field_0.field_0.X - iVar30 == 1) &&
          (iVar31 = FileStack[local_2de0].FileFrom3.field_0.field_0.Y,
          FileStack[local_2de0].FileTo3.field_0.field_0.Y - iVar31 == 1)) &&
         (iVar34 = FileStack[local_2de0].FileFrom3.field_0.field_0.Z,
         FileStack[local_2de0].FileTo3.field_0.field_0.Z - iVar34 == 1)) {
        lVar17 = 0x38;
        do {
          *(undefined8 *)((long)&uStack_1c48 + lVar17) = 0;
          *(undefined4 *)((long)auStack_1c40 + lVar17) = 0;
          *(undefined8 *)((long)&First.FileOrder + lVar17) = 0;
          lVar17 = lVar17 + 0x40;
        } while (lVar17 != 0x1038);
        iVar32 = (Idx2->ChunksPerFile3s).Arr[lVar11].field_0.field_0.X;
        iVar29 = 1;
        iVar28 = 1;
        if ((long)iVar32 != 0) {
          uVar19 = (long)iVar32 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar28 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar28 = 1;
          }
        }
        iVar35 = (Idx2->ChunksPerFile3s).Arr[lVar11].field_0.field_0.Y;
        if ((long)iVar35 != 0) {
          uVar19 = (long)iVar35 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar29 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar29 = 1;
          }
        }
        iVar3 = (Idx2->ChunksPerFile3s).Arr[lVar11].field_0.field_0.Z;
        if ((long)iVar3 == 0) {
          iVar22 = 1;
        }
        else {
          uVar19 = (long)iVar3 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar22 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar22 = 1;
          }
        }
        First.FileOrder = (Idx2->ChunksOrderInFile).Arr[local_2d60];
        iVar32 = iVar32 * iVar30;
        iVar35 = iVar35 * iVar31;
        First.FileFrom3.field_0.field_0.Z = iVar3 * iVar34;
        First.FileFrom3.field_0.field_0.Y = iVar35;
        First.FileFrom3.field_0.field_0.X = iVar32;
        First.PrevOrder = First.FileOrder;
        First.FileTo3.field_0.field_0.X = iVar28 + iVar32;
        First.FileTo3.field_0.field_0.Y = iVar29 + iVar35;
        First.FileTo3.field_0.field_0.Z = iVar22 + First.FileFrom3.field_0.field_0.Z;
        uVar19 = 0;
        First.Address = 0;
        local_1c08.field_0.X = 0;
        local_1c00[0] = 0;
LAB_0018a249:
        puVar24 = (ulong *)(local_1c08.E + uVar19 * 0x10 + -0xc);
        uVar20 = *puVar24;
        uVar18 = uVar20 >> 2;
        *puVar24 = uVar18;
        uVar33 = (uint)uVar20;
        if ((~uVar33 & 3) == 0) {
          if (uVar18 == 3) {
            *puVar24 = *(ulong *)(local_1c08.E + uVar19 * 0x10 + -10);
          }
          else {
            *(ulong *)(local_1c08.E + uVar19 * 0x10 + -10) = uVar18;
          }
          goto LAB_0018acec;
        }
        local_2ddc = (uint)uVar19 - 1;
        iVar30 = local_1c08.E[uVar19 * 0x10 + -8];
        if (((local_1c08.E[uVar19 * 0x10 + -5] - iVar30 != 1) ||
            (iVar31 = local_1c08.E[uVar19 * 0x10 + -7],
            local_1c08.E[uVar19 * 0x10 + -4] - iVar31 != 1)) ||
           (iVar34 = local_1c08.E[uVar19 * 0x10 + -6],
           local_1c08.E[uVar19 * 0x10 + -3] - iVar34 != 1)) {
          Second.FileTo3.field_0.field_0.Y = (int)*(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -4)
          ;
          Second.FileTo3.field_0.field_0.Z =
               (int)((ulong)*(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -4) >> 0x20);
          Second.Address = *(u64 *)(local_1c08.E + uVar19 * 0x10 + -2);
          local_2c08 = *(ulong *)(local_1c08.E + uVar19 * 0x10);
          local_2c00[0] = local_1c00[uVar19 * 8];
          Second.FileOrder = *puVar24;
          Second.PrevOrder = *(u64 *)(local_1c08.E + uVar19 * 0x10 + -10);
          Second.FileFrom3.field_0.field_3.XY.field_0 =
               (v2<int>)(v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                                  (local_1c08.E + uVar19 * 0x10 + -8);
          Second.FileFrom3.field_0.field_0.Z =
               (int)*(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -6);
          Second.FileTo3.field_0.field_0.X =
               (int)((ulong)*(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -6) >> 0x20);
          Second_1.ChunkOrder = *puVar24;
          Second_1.PrevOrder = *(u64 *)(local_1c08.E + uVar19 * 0x10 + -10);
          Second_1.ChunkFrom3.field_0.field_3.XY.field_0 =
               (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         (local_1c08.E + uVar19 * 0x10 + -8);
          Second_1._24_8_ = *(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -6);
          Second_1.ChunkTo3.field_0.field_4.YZ.field_0 =
               (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         (local_1c08.E + uVar19 * 0x10 + -4);
          Second_1.NChunksBefore = *(i64 *)(local_1c08.E + uVar19 * 0x10 + -2);
          Second_1.ChunkInFile = (local_1c08.E + uVar19 * 0x10)[0];
          Second_1._52_4_ = (local_1c08.E + uVar19 * 0x10)[1];
          Second_1.Address = local_1c00[uVar19 * 8];
          uVar20 = (ulong)((uVar33 & 3) << 2);
          iVar30 = *(int *)((long)&First + uVar20 + uVar19 * 0x40 + 0x10);
          iVar30 = (*(int *)((long)&First + uVar20 + uVar19 * 0x40 + 0x1c) - iVar30) / 2 + iVar30;
          *(int *)((long)&Second.FileTo3.field_0 + uVar20) = iVar30;
          *(int *)((long)&Second_1.ChunkFrom3.field_0 + uVar20) = iVar30;
          uVar23 = Second.Address;
          uVar10 = Second.FileTo3.field_0.field_0.X;
          uVar6 = Second.FileFrom3.field_0.field_0.X;
          uVar33 = Second.FileTo3.field_0.field_0.X - Second.FileFrom3.field_0._0_4_;
          lVar15 = (long)Second.FileTo3.field_0.field_0.Y;
          lVar17 = (long)Second.FileFrom3.field_0.field_0.Y;
          lVar36 = (long)Second.FileTo3.field_0.field_0.Z;
          lVar14 = (long)Second.FileFrom3.field_0.field_0.Z;
          Skip.From = (ulong)(Second.FileFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                      ((ulong)(uint)Second.FileFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                      (ulong)Second.FileFrom3.field_0.field_3.XY.field_0 & 0x1fffff;
          Skip.Dims = (ulong)((uint)(lVar36 - lVar14) & 0x1fffff) << 0x2a |
                      (ulong)((uint)(lVar15 - lVar17) & 0x1fffff) << 0x15 |
                      (ulong)(uVar33 & 0x1fffff);
          eVar39 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2d08);
          uVar21 = eVar39.Dims;
          Second_1.NChunksBefore =
               ((long)(uVar21 << 0x16) >> 0x2b) * ((long)(uVar21 << 0x2b) >> 0x2b) *
               ((long)(uVar21 * 2) >> 0x2b) + uVar23;
          iVar34 = (int)local_2c08;
          eVar39 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2c98);
          iVar34 = (((int)eVar39.Dims << 0xb) >> 0xb) * (int)((long)(eVar39.Dims * 2) >> 0x2b) *
                   (int)((long)(eVar39.Dims << 0x16) >> 0x2b) + iVar34;
          Second_1.ChunkInFile = iVar34;
          local_2c00[0] = local_1c00[uVar19 * 8];
          Second_1.Address =
               (long)(int)uVar33 * (lVar15 - lVar17) * (lVar36 - lVar14) + local_2c00[0];
          uVar20 = (long)(local_2d08.From << 0x16) >> 0xb;
          lVar17 = (long)(local_2d08.Dims << 0x16) >> 0xb;
          iVar30 = (int)((long)(local_2d08.Dims << 0x2b) >> 0x2b);
          iVar31 = (int)((long)(local_2d08.From << 0x2b) >> 0x2b);
          iVar32 = (int)((long)(local_2d08.From * 2) >> 0x2b);
          iVar28 = (int)((long)(local_2d08.Dims * 2) >> 0x2b) + iVar32;
          iVar29 = (int)((long)(local_2d08.From << 0x16) >> 0x2b);
          if (((Second_1.ChunkFrom3.field_0.field_0.X < iVar30 + iVar31) &&
              (Second_1.ChunkFrom3.field_0.field_0.Y <
               (int)((uVar20 & 0xffffffff00000000) + lVar17 >> 0x20))) &&
             ((Second_1.ChunkFrom3.field_0.field_0.Z < iVar28 &&
              (((iVar31 < Second_1.ChunkTo3.field_0.field_0.X &&
                (iVar29 < Second_1.ChunkTo3.field_0.field_0.Y)) &&
               (iVar32 < Second_1.ChunkTo3.field_0.field_0.Z)))))) {
            ((v2<int> *)(local_1c08.E + uVar19 * 0x10 + -4))->field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)Second_1.ChunkTo3.field_0.field_4.YZ.field_0
            ;
            *(i64 *)(local_1c08.E + uVar19 * 0x10 + -2) = Second_1.NChunksBefore;
            (local_1c08.E + uVar19 * 0x10)[0] = iVar34;
            (local_1c08.E + uVar19 * 0x10)[1] = Second_1._52_4_;
            local_1c00[uVar19 * 8] = Second_1.Address;
            *puVar24 = Second_1.ChunkOrder;
            *(u64 *)(local_1c08.E + uVar19 * 0x10 + -10) = Second_1.PrevOrder;
            ((v2<int> *)(local_1c08.E + uVar19 * 0x10 + -8))->field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)
                 Second_1.ChunkFrom3.field_0.field_3.XY.field_0;
            *(undefined8 *)(local_1c08.E + uVar19 * 0x10 + -6) = Second_1._24_8_;
            local_2ddc = (uint)uVar19;
          }
          if ((((int)uVar6 < iVar30 + iVar31) &&
              ((int)Second.FileFrom3.field_0._4_4_ <
               (int)(lVar17 + (uVar20 & 0xffffffff00000000) >> 0x20))) &&
             (((int)Second.FileFrom3.field_0._8_4_ < iVar28 && (iVar31 < (int)uVar10)))) {
            uVar19 = (ulong)local_2ddc;
            if ((iVar29 < Second.FileTo3.field_0.field_0.Y) &&
               (iVar32 < Second.FileTo3.field_0.field_0.Z)) {
              lVar17 = (long)(int)local_2ddc;
              uVar19 = (ulong)(local_2ddc + 1);
              auStack_1be0[lVar17 * 8 + 1] =
                   CONCAT44(Second.FileTo3.field_0.field_0.Z,Second.FileTo3.field_0.field_0.Y);
              auStack_1bc8[lVar17 * 8 + -1] = Second.Address;
              auStack_1bc8[lVar17 * 8] = local_2c08;
              auStack_1bc8[lVar17 * 8 + 1] = local_2c00[0];
              local_1c00[lVar17 * 8 + 1] = Second.FileOrder;
              *(u64 *)(auStack_1be8 + lVar17 * 0x40 + -8) = Second.PrevOrder;
              ((v2<int> *)(auStack_1be8 + lVar17 * 0x40))->field_0 =
                   (anon_union_8_4_6ba14846_for_v2<int>_1)
                   Second.FileFrom3.field_0.field_3.XY.field_0;
              auStack_1be0[lVar17 * 8] =
                   CONCAT44(Second.FileTo3.field_0.field_0.X,Second.FileFrom3.field_0.field_0.Z);
            }
          }
          else {
            uVar19 = (ulong)local_2ddc;
          }
          goto LAB_0018acec;
        }
        lVar17 = 0x38;
        do {
          *(undefined8 *)((long)&local_2c48.From + lVar17) = 0;
          *(undefined4 *)((long)&local_2c48.Dims + lVar17) = 0;
          *(undefined8 *)((long)&Second.FileOrder + lVar17) = 0;
          lVar17 = lVar17 + 0x40;
        } while (lVar17 != 0x1038);
        iVar32 = (Idx2->BricksPerChunk3s).Arr[lVar11].field_0.field_0.X;
        iVar29 = 1;
        iVar28 = 1;
        if ((long)iVar32 != 0) {
          uVar19 = (long)iVar32 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar28 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar28 = 1;
          }
        }
        iVar35 = (Idx2->BricksPerChunk3s).Arr[lVar11].field_0.field_0.Y;
        if ((long)iVar35 != 0) {
          uVar19 = (long)iVar35 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar29 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar29 = 1;
          }
        }
        iVar3 = (Idx2->BricksPerChunk3s).Arr[lVar11].field_0.field_0.Z;
        if ((long)iVar3 == 0) {
          iVar22 = 1;
        }
        else {
          uVar19 = (long)iVar3 - 1;
          lVar17 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar22 = (int)(1L << (-((byte)lVar17 ^ 0x3f) & 0x3f));
          if (uVar19 == 0) {
            iVar22 = 1;
          }
        }
        Second.FileOrder = (Idx2->BricksOrderInChunk).Arr[local_2d60];
        uVar33 = iVar32 * iVar30;
        uVar20 = (ulong)uVar33;
        iVar35 = iVar35 * iVar31;
        Second.FileFrom3.field_0.field_0.Z = iVar3 * iVar34;
        Second.FileFrom3.field_0.field_0.Y = iVar35;
        Second.FileFrom3.field_0.field_0.X = uVar33;
        uVar19 = (ulong)(iVar28 + uVar33);
        Second.PrevOrder = Second.FileOrder;
        Second.FileTo3.field_0.field_0.X = iVar28 + uVar33;
        Second.FileTo3.field_0.field_0.Y = iVar29 + iVar35;
        Second.FileTo3.field_0.field_0.Z = iVar22 + Second.FileFrom3.field_0.field_0.Z;
        uVar18 = 0;
        Second.Address = 0;
        local_2c08 = local_2c08 & 0xffffffff00000000;
        local_2c00[0] = 0;
LAB_0018a717:
        uVar33 = (uint)uVar18;
        lVar17 = uVar18 * 0x40;
        puVar24 = (ulong *)((long)&Second + lVar17);
        uVar16 = *puVar24;
        uVar13 = uVar16 >> 2;
        *puVar24 = uVar13;
        uVar27 = (uint)uVar16;
        if ((~uVar27 & 3) == 0) {
          if (uVar13 == 3) {
            *puVar24 = *(ulong *)((long)&Second + lVar17 + 8);
          }
          else {
            *(ulong *)((long)&Second + lVar17 + 8) = uVar13;
          }
        }
        else {
          uVar37 = uVar33 - 1;
          iVar30 = *(int *)((long)&Second + lVar17 + 0x10);
          if (((*(int *)((long)&Second + lVar17 + 0x1c) - iVar30 == 1) &&
              (iVar31 = *(int *)((long)&Second + lVar17 + 0x14),
              *(int *)((long)&Second + lVar17 + 0x20) - iVar31 == 1)) &&
             (iVar34 = *(int *)((long)&Second + lVar17 + 0x18),
             *(int *)((long)&Second + lVar17 + 0x24) - iVar34 == 1)) {
            Skip.From = (ulong)(iVar34 * uVar25 & 0x1fffff) << 0x2a |
                        (ulong)(iVar31 * (int)local_2d50 & 0x1fffff) << 0x15 |
                        (ulong)(iVar30 * uVar26 & 0x1fffff);
            Skip.Dims = local_2ce8;
            eVar39 = Crop<idx2::extent,idx2::extent>(&Skip,local_2ce0);
            Second_1.ChunkOrder = (u64)&D_local->Mutex;
            Second_1.PrevOrder = Second_1.PrevOrder & 0xffffffffffffff00;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&Second_1);
            Second_1.PrevOrder = CONCAT71(Second_1.PrevOrder._1_7_,1);
            D_local->NTasks = D_local->NTasks + 1;
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&Second_1);
            if (Mallocator()::Instance == '\0') {
              TraverseFirstLevel();
            }
            local_2c5c = 0;
            uStack_2c58 = 0;
            uStack_2c54 = 0;
            uStack_2c50 = 0;
            local_2c4c = 0;
            uVar18 = (&local_2c08)[uVar18 * 8];
            uStack_2c68 = *(undefined4 *)((long)&Second + lVar17 + 0x18);
            uVar4 = *(undefined8 *)((long)&Second + lVar17 + 0x10);
            uStack_2c70 = (undefined4)uVar4;
            uStack_2c6c = (undefined4)((ulong)uVar4 >> 0x20);
            Brick3.field_0.field_0.Y = 0;
            Brick3.field_0.field_0.X = *(uint *)((long)&Second + lVar17 + 0x18);
            Brick3.field_0._8_4_ = (undefined4)uVar20;
            uVar23 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_2d58,
                                    (int)*(undefined8 *)((long)&Second + lVar17 + 0x10),Brick3);
            pdVar9 = D_local;
            Second_1.ChunkOrder = 0;
            Second_1.PrevOrder = 0;
            Second_1.ChunkFrom3.field_0.field_3.XY.field_0 =
                 (v2<int>)(anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
            Second_1._24_8_ = 0;
            Second_1.ChunkOrder = (u64)operator_new(0xa8);
            *(undefined8 *)Second_1.ChunkOrder = 0;
            *(undefined8 *)(Second_1.ChunkOrder + 8) = 0;
            *(undefined8 **)(Second_1.ChunkOrder + 0x10) = &Mallocator()::Instance;
            *(undefined8 *)(Second_1.ChunkOrder + 0x18) = 0;
            *(undefined1 *)(Second_1.ChunkOrder + 0x20) = 10;
            *(ulong *)(Second_1.ChunkOrder + 0x21) = CONCAT17((undefined1)local_2c5c,uStack_2c63);
            *(ulong *)(Second_1.ChunkOrder + 0x29) =
                 CONCAT17((undefined1)uStack_2c54,CONCAT43(uStack_2c58,local_2c5c._1_3_));
            *(ulong *)(Second_1.ChunkOrder + 0x2c) = CONCAT44(uStack_2c54,uStack_2c58);
            *(ulong *)(Second_1.ChunkOrder + 0x34) = CONCAT44(local_2c4c,uStack_2c50);
            *(ulong *)(Second_1.ChunkOrder + 0x3c) = CONCAT44(uStack_2c70,local_2c74);
            *(ulong *)(Second_1.ChunkOrder + 0x44) = CONCAT44(uStack_2c68,uStack_2c6c);
            *(u64 *)(Second_1.ChunkOrder + 0x50) = uVar23;
            *(int *)(Second_1.ChunkOrder + 0x58) = (int)uVar18;
            *(char *)(Second_1.ChunkOrder + 0x5c) = Level;
            *(extent *)(Second_1.ChunkOrder + 0x60) = eVar39;
            *(idx2_file **)(Second_1.ChunkOrder + 0x70) = Idx2;
            *(params **)(Second_1.ChunkOrder + 0x78) = local_2cd8;
            *(decode_data ***)(Second_1.ChunkOrder + 0x80) = &D_local;
            *(grid **)(Second_1.ChunkOrder + 0x88) = local_2cd0;
            *(mmap_volume ***)(Second_1.ChunkOrder + 0x90) = &OutVolFile_local;
            *(volume ***)(Second_1.ChunkOrder + 0x98) = &OutVolMem_local;
            Second_1._24_8_ =
                 std::
                 _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                 ::_M_invoke;
            Second_1.ChunkFrom3.field_0.field_3.XY.field_0 =
                 (v2<int>)std::
                          _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                          ::_M_manager;
            __mutex = &(pdVar9->ThreadPool).tasks_mutex;
            iVar30 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
            if (iVar30 != 0) break;
            std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                      (&(pdVar9->ThreadPool).tasks.c,(value_type *)&Second_1);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            LOCK();
            paVar2 = &(pdVar9->ThreadPool).tasks_total;
            (paVar2->super___atomic_base<unsigned_long>)._M_i =
                 (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
            UNLOCK();
            std::condition_variable::notify_one();
            uVar33 = uVar37;
            if ((anon_union_8_4_6ba14846_for_v2<int>_1)
                Second_1.ChunkFrom3.field_0.field_3.XY.field_0 !=
                (anon_union_8_4_6ba14846_for_v2<int>_1)0x0) {
              (*(code *)Second_1.ChunkFrom3.field_0.field_3.XY.field_0)(&Second_1,&Second_1,3);
            }
          }
          else {
            Second_1.ChunkOrder = *puVar24;
            Second_1.PrevOrder = *(u64 *)((long)&Second + lVar17 + 8);
            uVar19 = *(ulong *)((long)&Second + lVar17 + 0x10);
            Second_1._24_8_ = *(undefined8 *)((long)&Second + lVar17 + 0x18);
            Second_1.ChunkTo3.field_0.field_4.YZ.field_0 =
                 (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)((long)&Second + lVar17 + 0x20);
            Second_1.NChunksBefore = *(i64 *)((long)&Second + lVar17 + 0x28);
            Second_1._48_8_ = (&local_2c08)[uVar18 * 8];
            Second_1.Address = local_2c00[uVar18 * 8];
            Skip.From = *puVar24;
            Skip.Dims = *(u64 *)((long)&Second + lVar17 + 8);
            uStack_2d38 = *(undefined8 *)((long)&Second + lVar17 + 0x10);
            uStack_2d30 = *(undefined8 *)((long)&Second + lVar17 + 0x18);
            local_2d28 = *(undefined8 *)((long)&Second + lVar17 + 0x20);
            lStack_2d20 = *(undefined8 *)((long)&Second + lVar17 + 0x28);
            uStack_2d18 = (&local_2c08)[uVar18 * 8];
            uStack_2d10 = local_2c00[uVar18 * 8];
            uVar20 = (ulong)((uVar27 & 3) << 2);
            iVar30 = *(int *)((long)&Second + uVar20 + lVar17 + 0x10);
            iVar30 = (*(int *)((long)&Second + uVar20 + lVar17 + 0x1c) - iVar30) / 2 + iVar30;
            *(int *)((long)&Second_1.ChunkTo3.field_0 + uVar20) = iVar30;
            iVar7 = Second_1.NChunksBefore;
            *(int *)((long)&uStack_2d38 + uVar20) = iVar30;
            Second_1.ChunkFrom3.field_0.field_0.X = (int)uVar19;
            uVar6 = Second_1.ChunkFrom3.field_0.field_0.X;
            Second_1.ChunkFrom3.field_0.field_0.Y = (int)(uVar19 >> 0x20);
            local_2d54 = Second_1.ChunkTo3.field_0.field_0.X;
            uVar27 = Second_1.ChunkTo3.field_0.field_0.X - Second_1.ChunkFrom3.field_0._0_4_;
            lVar38 = (long)Second_1.ChunkTo3.field_0.field_0.Y;
            lVar14 = (long)Second_1.ChunkFrom3.field_0.field_0.Y;
            lVar36 = (long)Second_1.ChunkTo3.field_0.field_0.Z;
            lVar15 = (long)Second_1.ChunkFrom3.field_0.field_0.Z;
            Skip_1.From = (ulong)(Second_1.ChunkFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                          ((ulong)(uint)Second_1.ChunkFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                          uVar19 & 0x1fffff;
            Skip_1.Dims = (ulong)((uint)(lVar36 - lVar15) & 0x1fffff) << 0x2a |
                          (ulong)((uint)(lVar38 - lVar14) & 0x1fffff) << 0x15 |
                          (ulong)(uVar27 & 0x1fffff);
            Second_1.ChunkFrom3.field_0._0_8_ = uVar19;
            eVar39 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2cf8);
            uVar23 = eVar39.Dims;
            lStack_2d20 = ((long)(uVar23 << 0x16) >> 0x2b) * ((long)(uVar23 << 0x2b) >> 0x2b) *
                          ((long)(uVar23 * 2) >> 0x2b) + iVar7;
            iVar8 = Second_1.ChunkInFile;
            eVar39 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2c88);
            uStack_2d18 = CONCAT44(uStack_2d18._4_4_,
                                   (((int)eVar39.Dims << 0xb) >> 0xb) *
                                   (int)((long)(eVar39.Dims * 2) >> 0x2b) *
                                   (int)((long)(eVar39.Dims << 0x16) >> 0x2b) + iVar8);
            Second_1.Address = local_2c00[uVar18 * 8];
            uStack_2d10 = (long)(int)uVar27 * (lVar38 - lVar14) * (lVar36 - lVar15) +
                          Second_1.Address;
            uVar16 = (long)(local_2cf8.From << 0x16) >> 0xb;
            lVar14 = (long)(local_2cf8.Dims << 0x16) >> 0xb;
            iVar30 = (int)((long)(local_2cf8.Dims << 0x2b) >> 0x2b);
            iVar31 = (int)((long)(local_2cf8.From << 0x2b) >> 0x2b);
            uVar27 = iVar30 + iVar31;
            uVar19 = (ulong)uVar27;
            iVar34 = (int)((long)(local_2cf8.From * 2) >> 0x2b);
            iVar29 = (int)((long)(local_2cf8.Dims * 2) >> 0x2b) + iVar34;
            iVar32 = (int)((long)(local_2cf8.From << 0x16) >> 0x2b);
            if ((int)uStack_2d38 < (int)uVar27) {
              uVar20 = (uVar16 & 0xffffffff00000000) + lVar14;
              uVar19 = uVar20 >> 0x20;
              if (((uStack_2d38._4_4_ < (int)(uVar20 >> 0x20)) && ((int)uStack_2d30 < iVar29)) &&
                 (iVar31 < uStack_2d30._4_4_)) {
                uVar19 = uVar16 >> 0x20;
                if ((iVar32 < (int)local_2d28) && (iVar34 < local_2d28._4_4_)) {
                  *(undefined8 *)((long)&Second + lVar17 + 0x20) = local_2d28;
                  *(long *)((long)&Second + lVar17 + 0x28) = lStack_2d20;
                  (&local_2c08)[uVar18 * 8] = uStack_2d18;
                  local_2c00[uVar18 * 8] = uStack_2d10;
                  *puVar24 = Skip.From;
                  *(u64 *)((long)&Second + lVar17 + 8) = Skip.Dims;
                  *(undefined8 *)((long)&Second + lVar17 + 0x10) = uStack_2d38;
                  *(undefined8 *)((long)&Second + lVar17 + 0x18) = uStack_2d30;
                  uVar37 = uVar33;
                }
              }
            }
            uVar27 = iVar30 + iVar31;
            uVar20 = (ulong)uVar27;
            uVar33 = uVar37;
            if ((int)uVar6 < (int)uVar27) {
              uVar19 = 0;
              uVar20 = uVar16 & 0xffffffff00000000;
              if ((((Second_1.ChunkFrom3.field_0.field_0.Y < (int)(lVar14 + uVar20 >> 0x20)) &&
                   (Second_1.ChunkFrom3.field_0.field_0.Z < iVar29)) && (iVar31 < local_2d54)) &&
                 ((iVar32 < Second_1.ChunkTo3.field_0.field_0.Y &&
                  (iVar34 < Second_1.ChunkTo3.field_0.field_0.Z)))) {
                lVar17 = (long)(int)uVar37;
                lVar14 = lVar17 * 0x40;
                ((v2<int> *)(auStack_2bd8 + lVar14))->field_0 =
                     (anon_union_8_4_6ba14846_for_v2<int>_1)
                     Second_1.ChunkTo3.field_0.field_4.YZ.field_0;
                auStack_2bd0[lVar17 * 8] = Second_1.NChunksBefore;
                auStack_2bd0[lVar17 * 8 + 1] = Second_1._48_8_;
                auStack_2bd0[lVar17 * 8 + 2] = Second_1.Address;
                local_2c00[lVar17 * 8 + 1] = Second_1.ChunkOrder;
                *(u64 *)(auStack_2be8 + lVar14 + -8) = Second_1.PrevOrder;
                ((v2<int> *)(auStack_2be8 + lVar14))->field_0 =
                     (anon_union_8_4_6ba14846_for_v2<int>_1)
                     Second_1.ChunkFrom3.field_0.field_3.XY.field_0;
                (&uStack_2be0)[lVar17 * 8] = Second_1._24_8_;
                uVar33 = uVar37 + 1;
              }
            }
          }
        }
        uVar18 = (ulong)uVar33;
        if ((int)uVar33 < 0) goto LAB_0018ace6;
        goto LAB_0018a717;
      }
      First.FileFrom3.field_0.field_3.XY.field_0 =
           (v2<int>)*(undefined8 *)&FileStack[local_2de0].FileFrom3.field_0;
      uVar4 = *(undefined8 *)((long)&FileStack[local_2de0].FileFrom3.field_0 + 8);
      uVar5 = *(undefined8 *)((long)&FileStack[local_2de0].FileTo3.field_0 + 4);
      First.FileTo3.field_0.field_0.Y = (int)uVar5;
      First.FileTo3.field_0.field_0.Z = (int)((ulong)uVar5 >> 0x20);
      First.Address = FileStack[local_2de0].Address;
      First.FileOrder = pfVar12->FileOrder;
      First.PrevOrder = FileStack[local_2de0].PrevOrder;
      First.FileFrom3.field_0.field_0.Z = (int)uVar4;
      First.FileTo3.field_0.field_0.X = (int)((ulong)uVar4 >> 0x20);
      Second.FileOrder = pfVar12->FileOrder;
      Second.PrevOrder = FileStack[local_2de0].PrevOrder;
      uVar4 = *(undefined8 *)((long)&FileStack[local_2de0].FileFrom3.field_0 + 8);
      uVar5 = *(undefined8 *)((long)&FileStack[local_2de0].FileTo3.field_0 + 4);
      Second.FileTo3.field_0.field_0.Y = (int)uVar5;
      Second.FileTo3.field_0.field_0.Z = (int)((ulong)uVar5 >> 0x20);
      Second.Address = FileStack[local_2de0].Address;
      Second.FileFrom3.field_0.field_3.XY.field_0 =
           (v2<int>)(v2<int>)FileStack[local_2de0].FileFrom3.field_0.field_3.XY.field_0;
      Second.FileFrom3.field_0.field_0.Z = (int)uVar4;
      Second.FileTo3.field_0.field_0.X = (int)((ulong)uVar4 >> 0x20);
      uVar19 = (ulong)((uVar33 & 3) << 2);
      iVar30 = *(int *)((long)&FileStack[local_2de0].FileFrom3.field_0 + uVar19);
      iVar30 = (*(int *)((long)&FileStack[local_2de0].FileTo3.field_0 + uVar19) - iVar30) / 2 +
               iVar30;
      *(int *)((long)&First.FileTo3.field_0 + uVar19) = iVar30;
      *(int *)((long)&Second.FileFrom3.field_0 + uVar19) = iVar30;
      First.Address = FileStack[local_2de0].Address;
      Second.Address =
           (long)(First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_) *
           ((long)First.FileTo3.field_0.field_0.Z - (long)First.FileFrom3.field_0.field_0.Z) *
           ((long)First.FileTo3.field_0.field_0.Y - (long)First.FileFrom3.field_0.field_0.Y) +
           First.Address;
      uVar19 = (long)(local_2ca8.From << 0x16) >> 0xb;
      lVar17 = (long)(local_2ca8.Dims << 0x16) >> 0xb;
      iVar30 = (int)((long)(local_2ca8.Dims << 0x2b) >> 0x2b);
      iVar31 = (int)((long)(local_2ca8.From << 0x2b) >> 0x2b);
      iVar34 = (int)((long)(local_2ca8.From * 2) >> 0x2b);
      iVar29 = (int)((long)(local_2ca8.Dims * 2) >> 0x2b) + iVar34;
      iVar32 = (int)((long)(local_2ca8.From << 0x16) >> 0x2b);
      if (((Second.FileFrom3.field_0.field_0.X < iVar30 + iVar31) &&
          (Second.FileFrom3.field_0.field_0.Y <
           (int)((uVar19 & 0xffffffff00000000) + lVar17 >> 0x20))) &&
         ((Second.FileFrom3.field_0.field_0.Z < iVar29 &&
          (((iVar31 < Second.FileTo3.field_0.field_0.X &&
            (iVar32 < Second.FileTo3.field_0.field_0.Y)) &&
           (iVar34 < Second.FileTo3.field_0.field_0.Z)))))) {
        FileStack[local_2de0].FileFrom3.field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)Second.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[local_2de0].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(Second.FileTo3.field_0.field_0.X,Second.FileFrom3.field_0.field_0.Z);
        *(ulong *)((long)&FileStack[local_2de0].FileTo3.field_0.field_3.XY.field_0 + 4) =
             CONCAT44(Second.FileTo3.field_0.field_0.Z,Second.FileTo3.field_0.field_0.Y);
        FileStack[local_2de0].Address = Second.Address;
        pfVar12->FileOrder = Second.FileOrder;
        FileStack[local_2de0].PrevOrder = Second.PrevOrder;
        FileStack[local_2de0].FileFrom3.field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)Second.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[local_2de0].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(Second.FileTo3.field_0.field_0.X,Second.FileFrom3.field_0.field_0.Z);
        uVar1 = local_2de0;
      }
      local_2de0 = uVar1;
      if ((((First.FileFrom3.field_0.field_0.X < iVar30 + iVar31) &&
           (First.FileFrom3.field_0.field_0.Y <
            (int)(lVar17 + (uVar19 & 0xffffffff00000000) >> 0x20))) &&
          ((First.FileFrom3.field_0.field_0.Z < iVar29 &&
           ((iVar31 < First.FileTo3.field_0.field_0.X && (iVar32 < First.FileTo3.field_0.field_0.Y))
           )))) && (iVar34 < First.FileTo3.field_0.field_0.Z)) {
        local_2de0 = local_2de0 + 1;
        *(undefined8 *)&FileStack[(int)local_2de0].FileFrom3.field_0 =
             First.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[(int)local_2de0].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
        *(ulong *)((long)&FileStack[(int)local_2de0].FileTo3.field_0.field_3.XY.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.Z,First.FileTo3.field_0.field_0.Y);
        FileStack[(int)local_2de0].Address = First.Address;
        FileStack[(int)local_2de0].FileOrder = First.FileOrder;
        FileStack[(int)local_2de0].PrevOrder = First.PrevOrder;
        *(undefined8 *)&FileStack[(int)local_2de0].FileFrom3.field_0 =
             First.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[(int)local_2de0].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
      }
    }
LAB_0018ada2:
    if ((int)local_2de0 < 0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1de;
      return (error<idx2::idx2_err_code>)ZEXT816(0x1bd71d);
    }
  } while( true );
  std::__throw_system_error(iVar30);
LAB_0018adff:
  TraverseFirstLevel();
  uVar19 = uVar19 & 0xffffffff;
  goto LAB_00189d63;
LAB_0018ace6:
  uVar19 = (ulong)local_2ddc;
LAB_0018acec:
  local_2de0 = uVar1;
  if ((int)uVar19 < 0) goto LAB_0018ada2;
  goto LAB_0018a249;
}

Assistant:

error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}